

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

char * fmt::v8::detail::
       parse_precision<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::specs_handler<char>_> *handler)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *local_30;
  precision_adapter local_28;
  
  pcVar2 = begin + 1;
  local_30 = pcVar2;
  if (pcVar2 == end) {
LAB_001146ea:
    specs_handler<char>::on_error(&handler->super_specs_handler<char>,"missing precision specifier")
    ;
    return pcVar2;
  }
  if ((int)*pcVar2 - 0x30U < 10) {
    iVar1 = parse_nonnegative_int<char>(&local_30,end,-1);
    if (iVar1 == -1) {
      specs_handler<char>::on_error(&handler->super_specs_handler<char>,"number is too big");
    }
    else {
      ((handler->super_specs_handler<char>).super_specs_setter<char>.specs_)->precision = iVar1;
    }
  }
  else {
    if (*pcVar2 != '{') goto LAB_001146ea;
    pcVar2 = begin + 2;
    if (pcVar2 != end) {
      local_28.handler = handler;
      if ((*pcVar2 == ':') || (*pcVar2 == '}')) {
        specs_handler<char>::on_dynamic_precision<fmt::v8::detail::auto_id>
                  (&handler->super_specs_handler<char>);
      }
      else {
        pcVar2 = do_parse_arg_id<char,fmt::v8::detail::parse_precision<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>(char_const*,char_const*,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&)::precision_adapter&>
                           (pcVar2,end,&local_28);
      }
    }
    pcVar3 = pcVar2;
    if ((pcVar2 == end) || (pcVar3 = pcVar2 + 1, local_30 = pcVar3, *pcVar2 != '}')) {
      specs_handler<char>::on_error(&handler->super_specs_handler<char>,"invalid format string");
      return pcVar3;
    }
  }
  specs_checker<fmt::v8::detail::specs_handler<char>_>::end_precision(handler);
  return local_30;
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  using detail::auto_id;
  struct precision_adapter {
    Handler& handler;

    FMT_CONSTEXPR void operator()() { handler.on_dynamic_precision(auto_id()); }
    FMT_CONSTEXPR void operator()(int id) { handler.on_dynamic_precision(id); }
    FMT_CONSTEXPR void operator()(basic_string_view<Char> id) {
      handler.on_dynamic_precision(id);
    }
    FMT_CONSTEXPR void on_error(const char* message) {
      if (message) handler.on_error(message);
    }
  };

  ++begin;
  auto c = begin != end ? *begin : Char();
  if ('0' <= c && c <= '9') {
    auto precision = parse_nonnegative_int(begin, end, -1);
    if (precision != -1)
      handler.on_precision(precision);
    else
      handler.on_error("number is too big");
  } else if (c == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, precision_adapter{handler});
    if (begin == end || *begin++ != '}')
      return handler.on_error("invalid format string"), begin;
  } else {
    return handler.on_error("missing precision specifier"), begin;
  }
  handler.end_precision();
  return begin;
}